

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EmissionSystem::SetEmitterBeams
          (EmissionSystem *this,
          vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_> *Beams
          )

{
  pointer pEVar1;
  KUINT8 KVar2;
  pointer this_00;
  
  std::vector<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>::
  operator=(&this->m_vEmitterBeams,Beams);
  this_00 = (this->m_vEmitterBeams).
            super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_vEmitterBeams).
           super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui8NumberOfBeams = (KUINT8)((uint)((int)pEVar1 - (int)this_00) >> 7);
  this->m_ui8SystemDataLength = '\x05';
  for (; this_00 != pEVar1; this_00 = this_00 + 1) {
    KVar2 = EmitterBeam::GetBeamDataLength(this_00);
    this->m_ui8SystemDataLength = this->m_ui8SystemDataLength + KVar2;
  }
  return;
}

Assistant:

void EmissionSystem::SetEmitterBeams( const vector<EmitterBeam> & Beams )
{
    m_vEmitterBeams = Beams;
    m_ui8NumberOfBeams = m_vEmitterBeams.size();

    // Re-Calculate the System Data Length
    m_ui8SystemDataLength = EMISSION_SYSTEM_SIZE / 4;

    vector<EmitterBeam>::const_iterator citr = m_vEmitterBeams.begin();
    vector<EmitterBeam>::const_iterator citrEnd = m_vEmitterBeams.end();

    for( ; citr != citrEnd; ++citr )
    {
        m_ui8SystemDataLength += citr->GetBeamDataLength();
    }
}